

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O0

void __thiscall ON_ScaleValue::SwapLeftAndRight(ON_ScaleValue *this)

{
  ON_wString *src;
  ON_ScaleValue local_d8;
  undefined1 local_48 [8];
  ON_LengthValue t;
  double x;
  ON_ScaleValue *this_local;
  
  t.m_length_as_string.m_s = (wchar_t *)this->m_left_to_right_scale;
  this->m_left_to_right_scale = this->m_right_to_left_scale;
  this->m_right_to_left_scale = (double)t.m_length_as_string.m_s;
  ON_LengthValue::ON_LengthValue((ON_LengthValue *)local_48,&this->m_left_length);
  ON_LengthValue::operator=(&this->m_left_length,&this->m_right_length);
  ON_LengthValue::operator=(&this->m_right_length,(ON_LengthValue *)local_48);
  Create(&local_d8,&this->m_left_length,&this->m_right_length,None);
  src = ScaleAsString(&local_d8);
  ON_wString::operator=(&this->m_scale_as_string,src);
  ~ON_ScaleValue(&local_d8);
  ON_LengthValue::~ON_LengthValue((ON_LengthValue *)local_48);
  return;
}

Assistant:

void ON_ScaleValue::SwapLeftAndRight()
{
  double x = m_left_to_right_scale;
  m_left_to_right_scale = m_right_to_left_scale;
  m_right_to_left_scale = x;

  ON_LengthValue t = m_left_length;
  m_left_length = m_right_length;
  m_right_length = t;

  // TODO: properly reverse string
  m_scale_as_string = ON_ScaleValue::Create(m_left_length,m_right_length,ON_ScaleValue::ScaleStringFormat::None).ScaleAsString();
}